

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Algorithms.cpp
# Opt level: O0

bool __thiscall Algorithms::isPrime_MillerRabin(Algorithms *this,BigInteger *n,int k)

{
  bool bVar1;
  bool local_244;
  BigInteger local_238;
  BigInteger local_218;
  BigInteger local_1f8;
  BigInteger local_1d8;
  int local_1b8;
  byte local_1b1;
  int j;
  bool flag;
  BigInteger local_1a8;
  BigInteger local_188;
  undefined1 local_168 [8];
  BigInteger x;
  BigInteger local_128;
  undefined1 local_108 [8];
  BigInteger a;
  undefined1 local_e0 [4];
  int i;
  BigInteger local_c0;
  int local_9c;
  undefined1 local_98 [4];
  int s;
  BigInteger m;
  BigInteger local_68;
  BigInteger local_48;
  int local_24;
  BigInteger *pBStack_20;
  int k_local;
  BigInteger *n_local;
  Algorithms *this_local;
  
  local_24 = k;
  pBStack_20 = n;
  n_local = (BigInteger *)this;
  BigIntegerLibrary::BigInteger::operator%(&local_48,n,2);
  BigIntegerLibrary::BigInteger::BigInteger(&local_68,0);
  bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_48,&local_68);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_68);
  BigIntegerLibrary::BigInteger::~BigInteger(&local_48);
  if (bVar1) {
    this_local._7_1_ = 0;
  }
  else {
    BigIntegerLibrary::BigInteger::operator-((BigInteger *)local_98,pBStack_20,1);
    local_9c = 0;
    while( true ) {
      BigIntegerLibrary::BigInteger::operator%(&local_c0,(BigInteger *)local_98,2);
      BigIntegerLibrary::BigInteger::BigInteger((BigInteger *)local_e0,0);
      bVar1 = BigIntegerLibrary::BigInteger::operator==(&local_c0,(BigInteger *)local_e0);
      BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_e0);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_c0);
      if (!bVar1) break;
      local_9c = local_9c + 1;
      BigIntegerLibrary::BigInteger::operator/=((BigInteger *)local_98,2);
    }
    for (a._28_4_ = 0; (int)a._28_4_ < local_24; a._28_4_ = a._28_4_ + 1) {
      BigIntegerLibrary::BigInteger::BigInteger(&local_128,2);
      BigIntegerLibrary::BigInteger::operator-((BigInteger *)&x.isNegative,pBStack_20,2);
      random((Algorithms *)local_108);
      BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)&x.isNegative);
      BigIntegerLibrary::BigInteger::~BigInteger(&local_128);
      BigIntegerLibrary::powm
                ((BigInteger *)local_168,(BigInteger *)local_108,(BigInteger *)local_98,pBStack_20);
      flag = false;
      BigIntegerLibrary::BigInteger::BigInteger(&local_188,1);
      bVar1 = BigIntegerLibrary::BigInteger::operator==((BigInteger *)local_168,&local_188);
      local_244 = true;
      if (!bVar1) {
        BigIntegerLibrary::BigInteger::operator-(&local_1a8,pBStack_20,1);
        flag = true;
        local_244 = BigIntegerLibrary::BigInteger::operator==((BigInteger *)local_168,&local_1a8);
      }
      if ((flag & 1U) != 0) {
        BigIntegerLibrary::BigInteger::~BigInteger(&local_1a8);
      }
      BigIntegerLibrary::BigInteger::~BigInteger(&local_188);
      if (local_244 == false) {
        local_1b1 = 0;
        for (local_1b8 = 0; local_1b8 < local_9c + -1; local_1b8 = local_1b8 + 1) {
          BigIntegerLibrary::BigInteger::operator*
                    (&local_1f8,(BigInteger *)local_168,(BigInteger *)local_168);
          BigIntegerLibrary::BigInteger::operator%(&local_1d8,&local_1f8,pBStack_20);
          BigIntegerLibrary::BigInteger::operator=((BigInteger *)local_168,&local_1d8);
          BigIntegerLibrary::BigInteger::~BigInteger(&local_1d8);
          BigIntegerLibrary::BigInteger::~BigInteger(&local_1f8);
          BigIntegerLibrary::BigInteger::BigInteger(&local_218,1);
          bVar1 = BigIntegerLibrary::BigInteger::operator==((BigInteger *)local_168,&local_218);
          BigIntegerLibrary::BigInteger::~BigInteger(&local_218);
          if (bVar1) {
            this_local._7_1_ = 0;
            j = 1;
            goto LAB_0010c35c;
          }
          BigIntegerLibrary::BigInteger::operator-(&local_238,pBStack_20,1);
          bVar1 = BigIntegerLibrary::BigInteger::operator==((BigInteger *)local_168,&local_238);
          BigIntegerLibrary::BigInteger::~BigInteger(&local_238);
          if (bVar1) {
            local_1b1 = 1;
            break;
          }
        }
        if ((local_1b1 & 1) == 0) {
          this_local._7_1_ = 0;
          j = 1;
        }
        else {
          j = 0;
        }
      }
      else {
        j = 6;
      }
LAB_0010c35c:
      BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_168);
      BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_108);
      if ((j != 0) && (j != 6)) goto LAB_0010c3d1;
    }
    this_local._7_1_ = 1;
    j = 1;
LAB_0010c3d1:
    BigIntegerLibrary::BigInteger::~BigInteger((BigInteger *)local_98);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Algorithms::isPrime_MillerRabin(const BigInteger &n, int k) {
    if (n % 2 == 0) {
        return false;
    }
    BigInteger m = (n - 1);
    int s = 0;
    while (m % 2 == 0) {
        ++s;
        m /= 2;
    }
    for (int i = 0; i < k; ++i) {
        BigInteger a = random(2, n - 2);
        BigInteger x = powm(a, m, n);
        if (x == 1 || x == n - 1) {
            continue;
        }
        bool flag = false;
        for (int j = 0; j < s - 1; ++j) {
            x = x * x % n;
            if (x == 1) {
                return false;
            }
            if (x == n - 1) {
                flag = true;
                break;
            }
        }
        if (!flag) {
            return false;
        }
    }
    return true;
}